

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoflann.hpp
# Opt level: O1

NodePtr __thiscall
nanoflann::
KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
::divideTree(KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
             *this,KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                   *obj,unsigned_long left,unsigned_long right,BoundingBox *bbox)

{
  pointer puVar1;
  pointer puVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  undefined8 uVar5;
  long lVar6;
  NodePtr pNVar7;
  ulong uVar8;
  BoundingBox *pBVar9;
  NodePtr pNVar10;
  long lVar11;
  BoundingBox *pBVar12;
  KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
  *obj_00;
  long lVar13;
  BoundingBox *pBVar14;
  pointer puVar15;
  BoundingBox *bbox_00;
  ulong uVar16;
  long lVar17;
  undefined1 *puVar18;
  bool bVar19;
  bool bVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  BoundingBox right_bbox;
  BoundingBox left_bbox;
  ulong local_c8;
  double local_98;
  long alStack_90 [6];
  double adStack_60 [6];
  
  pNVar7 = (NodePtr)PooledAllocator::malloc(&this->pool,0x28);
  uVar8 = left - (long)obj;
  if (uVar8 <= this->m_leaf_max_size) {
    pNVar7->child1 = (Node *)0x0;
    pNVar7->child2 = (Node *)0x0;
    (pNVar7->node_type).lr.left = (unsigned_long)obj;
    (pNVar7->node_type).lr.right = left;
    uVar4 = (this->vind).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[(long)obj];
    uVar3 = *this[1].vind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = 0;
    do {
      uVar5 = *(undefined8 *)(uVar4 * 0x18 + uVar3 + lVar11);
      *(undefined8 *)(right + lVar11 * 2) = uVar5;
      *(undefined8 *)(right + 8 + lVar11 * 2) = uVar5;
      lVar11 = lVar11 + 8;
    } while (lVar11 != 0x18);
    puVar18 = (undefined1 *)
              ((long)&(obj->
                      super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                      ).vind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start + 1);
    if (puVar18 < left) {
      puVar2 = (this->vind).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar4 = *this[1].vind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        uVar3 = puVar2[(long)puVar18];
        lVar11 = 0;
        do {
          dVar21 = *(double *)(uVar4 + uVar3 * 0x18 + lVar11);
          if (dVar21 < *(double *)(right + lVar11 * 2)) {
            *(double *)(right + lVar11 * 2) = dVar21;
          }
          if (*(double *)(right + 8 + lVar11 * 2) < dVar21) {
            *(double *)(right + 8 + lVar11 * 2) = dVar21;
          }
          lVar11 = lVar11 + 8;
        } while (lVar11 != 0x18);
        puVar18 = puVar18 + 1;
      } while (puVar18 != (undefined1 *)left);
    }
    return pNVar7;
  }
  puVar2 = (this->vind).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar23 = ZEXT864((ulong)(*(double *)(right + 8) - *(double *)right));
  lVar11 = 0x18;
  do {
    auVar24._8_8_ = 0;
    auVar24._0_8_ = *(double *)(right + lVar11) - *(double *)((right - 8) + lVar11);
    auVar24 = vmaxsd_avx(auVar24,auVar23._0_16_);
    auVar23 = ZEXT1664(auVar24);
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x38);
  puVar1 = puVar2 + (long)obj;
  puVar15 = this[1].vind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  dVar21 = -1.0;
  local_c8 = 0;
  uVar16 = 0;
  do {
    if (auVar24._0_8_ * 0.99999 <
        *(double *)(right + 8 + uVar16 * 0x10) - *(double *)(right + uVar16 * 0x10)) {
      lVar11 = uVar16 * 8 + *puVar15;
      dVar26 = *(double *)(lVar11 + *puVar1 * 0x18);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar26;
      puVar18 = (undefined1 *)
                ((long)&(obj->
                        super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                        ).vind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + 1);
      dVar29 = dVar26;
      auVar25 = auVar27;
      if (1 < uVar8) {
        do {
          auVar32._8_8_ = 0;
          auVar32._0_8_ = *(ulong *)(lVar11 + puVar2[(long)puVar18] * 0x18);
          auVar25 = vminsd_avx(auVar32,auVar25);
          dVar29 = auVar25._0_8_;
          auVar27 = vmaxsd_avx(auVar32,auVar27);
          dVar26 = auVar27._0_8_;
          puVar18 = puVar18 + 1;
        } while ((undefined1 *)left != puVar18);
      }
      if (dVar21 < dVar26 - dVar29) {
        local_c8 = uVar16 & 0xffffffff;
        dVar21 = dVar26 - dVar29;
      }
    }
    uVar16 = uVar16 + 1;
  } while (uVar16 != 3);
  lVar11 = (long)(int)local_c8;
  lVar13 = lVar11 * 8;
  lVar17 = *puVar15 + lVar13;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(lVar17 + *puVar1 * 0x18);
  auVar24 = auVar25;
  if (1 < uVar8) {
    puVar15 = (pointer)((long)&(obj->
                               super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                               ).vind.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start + 1);
    do {
      auVar30._8_8_ = 0;
      auVar30._0_8_ = *(ulong *)(lVar17 + puVar2[(long)puVar15] * 0x18);
      auVar24 = vminsd_avx(auVar30,auVar24);
      auVar25 = vmaxsd_avx(auVar30,auVar25);
      puVar15 = (pointer)((long)puVar15 + 1);
    } while ((pointer)left != puVar15);
  }
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (*(double *)(right + lVar11 * 0x10) + *(double *)(right + 8 + lVar11 * 0x10)) * 0.5;
  auVar27 = vminsd_avx(auVar25,auVar22);
  uVar5 = vcmpsd_avx512f(auVar22,auVar24,1);
  bVar19 = (bool)((byte)uVar5 & 1);
  dVar21 = (double)((ulong)bVar19 * auVar24._0_8_ + (ulong)!bVar19 * auVar27._0_8_);
  pBVar9 = (BoundingBox *)(uVar8 - 1);
  pBVar14 = (BoundingBox *)0x0;
  pBVar12 = pBVar9;
  do {
    while ((pBVar14 <= pBVar12 && (*(double *)(lVar17 + puVar1[(long)pBVar14] * 0x18) < dVar21))) {
      pBVar14 = (BoundingBox *)((long)&pBVar14->_M_elems[0].low + 1);
    }
    bVar20 = pBVar12 == (BoundingBox *)0x0;
    bbox_00 = (BoundingBox *)CONCAT71((int7)((ulong)puVar15 >> 8),pBVar12 < pBVar14 || bVar20);
    bVar19 = !bVar20;
    if ((pBVar12 >= pBVar14 && !bVar20) &&
       (bVar19 = true, dVar21 <= *(double *)(lVar17 + puVar1[(long)pBVar12] * 0x18))) {
      while( true ) {
        pBVar12 = (BoundingBox *)((long)&pBVar12[-1]._M_elems[2].high + 7);
        bVar19 = pBVar12 != (BoundingBox *)0x0;
        bbox_00 = (BoundingBox *)CONCAT71((int7)((ulong)bbox_00 >> 8),bVar19);
        if (pBVar12 < pBVar14) break;
        if ((!bVar19) ||
           (bVar19 = true, *(double *)(lVar17 + puVar1[(long)pBVar12] * 0x18) < dVar21)) break;
      }
    }
    if ((pBVar12 < pBVar14) || (!bVar19)) {
      puVar2 = this[1].vind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pBVar12 = pBVar14;
      do {
        if (pBVar12 <= pBVar9) {
          bbox_00 = (BoundingBox *)(*puVar2 + lVar13);
          do {
            if (dVar21 < *(double *)((long)bbox_00->_M_elems + puVar1[(long)pBVar12] * 0x18)) break;
            pBVar12 = (BoundingBox *)((long)&pBVar12->_M_elems[0].low + 1);
          } while (pBVar12 <= pBVar9);
        }
        bVar19 = pBVar9 != (BoundingBox *)0x0;
        if ((bVar19) && (pBVar12 <= pBVar9)) {
          lVar17 = *puVar2 + lVar13;
          bVar19 = true;
          if (dVar21 < *(double *)(lVar17 + puVar1[(long)pBVar9] * 0x18)) {
            bbox_00 = (BoundingBox *)((long)&pBVar9[-1]._M_elems[2].high + 7);
            do {
              pBVar9 = bbox_00;
              bVar19 = pBVar9 != (BoundingBox *)0x0;
              bbox_00 = (BoundingBox *)((long)&pBVar9[-1]._M_elems[2].high + 7);
              if ((pBVar9 < pBVar12) || (!bVar19)) break;
              bVar19 = true;
            } while (dVar21 < *(double *)(lVar17 + puVar1[(long)pBVar9] * 0x18));
          }
        }
        if ((pBVar9 < pBVar12) || (!bVar19)) {
          pBVar9 = (BoundingBox *)(uVar8 >> 1);
          if (pBVar9 <= pBVar12) {
            pBVar12 = pBVar9;
          }
          if (pBVar9 < pBVar14) {
            pBVar12 = pBVar14;
          }
          (pNVar7->node_type).sub.divfeat = (int)local_c8;
          alStack_90[5] = *(long *)right;
          adStack_60[0] = *(double *)(right + 8);
          adStack_60[1] = *(double *)(right + 0x10);
          adStack_60[2] = *(double *)(right + 0x18);
          adStack_60[3] = *(double *)(right + 0x20);
          adStack_60[4] = *(double *)(right + 0x28);
          adStack_60[lVar11 * 2] = dVar21;
          obj_00 = (KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                    *)((long)&(obj->
                              super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                              ).root_bbox._M_elems[0].low + (long)(pBVar12->_M_elems + -4));
          pNVar10 = divideTree(this,obj,(unsigned_long)obj_00,(unsigned_long)(alStack_90 + 5),
                               bbox_00);
          pNVar7->child1 = pNVar10;
          local_98 = *(double *)right;
          alStack_90[0] = *(long *)(right + 8);
          alStack_90[1] = *(undefined8 *)(right + 0x10);
          alStack_90[2] = *(undefined8 *)(right + 0x18);
          alStack_90[3] = *(undefined8 *)(right + 0x20);
          alStack_90[4] = *(undefined8 *)(right + 0x28);
          (&local_98)[lVar11 * 2] = dVar21;
          pNVar10 = divideTree(this,obj_00,left,(unsigned_long)&local_98,bbox_00);
          pNVar7->child2 = pNVar10;
          (pNVar7->node_type).lr.right = (unsigned_long)adStack_60[lVar11 * 2];
          (pNVar7->node_type).sub.divhigh = (&local_98)[lVar11 * 2];
          lVar11 = 0;
          do {
            lVar13 = *(long *)((long)adStack_60 + lVar11 + -8);
            lVar17 = *(long *)((long)adStack_60 + lVar11);
            lVar6 = *(long *)((long)alStack_90 + lVar11);
            auVar28._8_8_ = lVar17;
            auVar28._0_8_ = *(long *)((long)&local_98 + lVar11);
            auVar31._8_8_ = lVar6;
            auVar31._0_8_ = lVar13;
            uVar8 = vcmppd_avx512vl(auVar28,auVar31,1);
            bVar19 = (bool)((byte)(uVar8 & 3) & 1);
            uVar8 = (uVar8 & 3) >> 1;
            *(ulong *)(right + lVar11) =
                 (ulong)bVar19 * *(long *)((long)&local_98 + lVar11) | (ulong)!bVar19 * lVar13;
            ((ulong *)(right + lVar11))[1] = uVar8 * lVar6 | (ulong)!SUB81(uVar8,0) * lVar17;
            lVar11 = lVar11 + 0x10;
          } while (lVar11 != 0x30);
          return pNVar7;
        }
        uVar4 = puVar1[(long)pBVar12];
        bbox_00 = (BoundingBox *)puVar1[(long)pBVar9];
        puVar1[(long)pBVar12] = (unsigned_long)bbox_00;
        puVar1[(long)pBVar9] = uVar4;
        pBVar12 = (BoundingBox *)((long)&pBVar12->_M_elems[0].low + 1);
        pBVar9 = (BoundingBox *)((long)&pBVar9[-1]._M_elems[2].high + 7);
      } while( true );
    }
    uVar4 = puVar1[(long)pBVar14];
    puVar15 = (pointer)puVar1[(long)pBVar12];
    puVar1[(long)pBVar14] = (unsigned_long)puVar15;
    puVar1[(long)pBVar12] = uVar4;
    pBVar14 = (BoundingBox *)((long)&pBVar14->_M_elems[0].low + 1);
    pBVar12 = (BoundingBox *)((long)&pBVar12[-1]._M_elems[2].high + 7);
  } while( true );
}

Assistant:

NodePtr divideTree(Derived &obj, const IndexType left, const IndexType right,
                     BoundingBox &bbox) {
    NodePtr node = obj.pool.template allocate<Node>(); // allocate memory

    /* If too few exemplars remain, then make this a leaf node. */
    if ((right - left) <= static_cast<IndexType>(obj.m_leaf_max_size)) {
      node->child1 = node->child2 = NULL; /* Mark as leaf node. */
      node->node_type.lr.left = left;
      node->node_type.lr.right = right;

      // compute bounding-box of leaf points
      for (int i = 0; i < (DIM > 0 ? DIM : obj.dim); ++i) {
        bbox[i].low = dataset_get(obj, obj.vind[left], i);
        bbox[i].high = dataset_get(obj, obj.vind[left], i);
      }
      for (IndexType k = left + 1; k < right; ++k) {
        for (int i = 0; i < (DIM > 0 ? DIM : obj.dim); ++i) {
          if (bbox[i].low > dataset_get(obj, obj.vind[k], i))
            bbox[i].low = dataset_get(obj, obj.vind[k], i);
          if (bbox[i].high < dataset_get(obj, obj.vind[k], i))
            bbox[i].high = dataset_get(obj, obj.vind[k], i);
        }
      }
    } else {
      IndexType idx;
      int cutfeat;
      DistanceType cutval;
      middleSplit_(obj, &obj.vind[0] + left, right - left, idx, cutfeat, cutval,
                   bbox);

      node->node_type.sub.divfeat = cutfeat;

      BoundingBox left_bbox(bbox);
      left_bbox[cutfeat].high = cutval;
      node->child1 = divideTree(obj, left, left + idx, left_bbox);

      BoundingBox right_bbox(bbox);
      right_bbox[cutfeat].low = cutval;
      node->child2 = divideTree(obj, left + idx, right, right_bbox);

      node->node_type.sub.divlow = left_bbox[cutfeat].high;
      node->node_type.sub.divhigh = right_bbox[cutfeat].low;

      for (int i = 0; i < (DIM > 0 ? DIM : obj.dim); ++i) {
        bbox[i].low = std::min(left_bbox[i].low, right_bbox[i].low);
        bbox[i].high = std::max(left_bbox[i].high, right_bbox[i].high);
      }
    }

    return node;
  }